

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O1

GherkinLine * GherkinLine_new(wchar_t *line_text,wchar_t line_number)

{
  wchar_t *pwVar1;
  _Bool _Var2;
  GherkinLine *pGVar3;
  wchar_t wchar;
  
  pGVar3 = (GherkinLine *)malloc(0x18);
  pGVar3->line_number = line_number;
  pGVar3->indent = 0;
  pGVar3->line_text = line_text;
  pGVar3->trimmed_line = line_text;
  wchar = *line_text;
  while (wchar != L'\0') {
    _Var2 = StringUtilities_is_whitespace(wchar);
    if (!_Var2) break;
    pGVar3->indent = pGVar3->indent + 1;
    pwVar1 = line_text + 1;
    line_text = line_text + 1;
    wchar = *pwVar1;
  }
  pGVar3->trimmed_line = line_text;
  return pGVar3;
}

Assistant:

const GherkinLine* GherkinLine_new(const wchar_t* line_text, int line_number) {
    GherkinLine* line = (GherkinLine*)malloc(sizeof(GherkinLine));
    line->line_number = line_number;
    line->indent = 0;
    line->line_text = line_text;
    line->trimmed_line = line_text;
    while (line->trimmed_line[0] != '\0' && StringUtilities_is_whitespace(line->trimmed_line[0])) {
        ++line->trimmed_line;
        ++line->indent;
    }
    return line;
}